

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

uint32_t prf_model_add_vertex(prf_model_t *model,prf_vertex_t *vertex)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  prf_vertex_pool_s **pppVar4;
  void *elem;
  uint8_t *puVar5;
  prf_vertex_pool_s *ppVar6;
  ulong uVar7;
  ushort uVar8;
  bool bVar9;
  
  if (model->vertextras == (prf_vertex_pool_s **)0x0) {
    pppVar4 = (prf_vertex_pool_s **)prf_array_init(4,8);
    model->vertextras = pppVar4;
    elem = malloc(0x10);
    pppVar4 = (prf_vertex_pool_s **)prf_array_append_ptr(pppVar4,elem);
    model->vertextras = pppVar4;
    puVar5 = (uint8_t *)malloc(0x8000);
    (*pppVar4)->data = puVar5;
    ppVar6 = *pppVar4;
    ppVar6->data_size = 0x8000;
    ppVar6->position = 0;
  }
  bVar9 = vertex->has_texture != 0;
  uVar8 = (ushort)bVar9 * 3 + 0x44;
  uVar1 = (ushort)bVar9 * 8 + 0x28;
  if (vertex->has_normal != 0) {
    uVar8 = bVar9 + 0x45;
    uVar1 = (ushort)bVar9 * 8 + 0x34;
  }
  uVar2 = prf_array_count(model->vertextras);
  uVar7 = 0;
  do {
    ppVar6 = model->vertextras[uVar7];
    uVar7 = uVar7 + 1;
  } while (uVar2 != uVar7);
  if (ppVar6->data_size - ppVar6->position < (uint)uVar1) {
    ppVar6 = (prf_vertex_pool_s *)malloc(0x10);
    puVar5 = (uint8_t *)malloc(0x8000);
    ppVar6->data = puVar5;
    ppVar6->data_size = 0x8000;
    ppVar6->position = 0;
    pppVar4 = (prf_vertex_pool_s **)prf_array_append_ptr(model->vertextras,ppVar6);
    model->vertextras = pppVar4;
  }
  puVar5 = ppVar6->data;
  uVar2 = ppVar6->position;
  ppVar6->position = uVar2 + uVar1;
  *(ushort *)(puVar5 + uVar2) = uVar8;
  *(ushort *)(puVar5 + (ulong)uVar2 + 2) = uVar1;
  *(float64_t *)(puVar5 + (ulong)uVar2 + 4) = vertex->x;
  *(float64_t *)(puVar5 + (ulong)uVar2 + 0xc) = vertex->y;
  *(float64_t *)(puVar5 + (ulong)uVar2 + 0x14) = vertex->z;
  *(uint16_t *)(puVar5 + (ulong)uVar2 + 0x1c) = vertex->color_name_index;
  *(uint16_t *)(puVar5 + (ulong)uVar2 + 0x1e) = vertex->flags;
  uVar3 = (*(code *)(&DAT_0010d0b4 + *(int *)(&DAT_0010d0b4 + (ulong)(uVar8 - 0x44) * 4)))();
  return uVar3;
}

Assistant:

uint32_t
prf_model_add_vertex( 
    prf_model_t * model,
    prf_vertex_t * vertex )
{
    uint8_t * ptr8;
    uint16_t * ptr16;

    uint32_t offset;
    prf_vertex_pool_t * pool = NULL;
    uint16_t opcode;
    uint16_t length;
    int i, count;

    assert( model != NULL && vertex != NULL );
    assert( model->vertex_palette != NULL );

    if ( model->vertextras == NULL ) {
        if ( prf_vertextras_init( model ) == FALSE )
            return FALSE;
    }
    if ( vertex->has_normal != FALSE ) {
        if ( vertex->has_texture != FALSE ) {
            opcode = 70;
            length = 4+3*8+4+5*4+4+4;
        } else {
            opcode = 69;
            length = 4+3*8+4+3*4+4+4;
        }
    } else {
        if ( vertex->has_texture != FALSE ) {
            opcode = 71;
            length = 4+3*8+4+2*4+4+4;
        } else {
            opcode = 68;
            length = 4+3*8+4+4+4;
        }
    }

    offset = ((uint32_t *) (model->vertex_palette->data))[0];
    count = prf_array_count( model->vertextras );
    for ( i = 0; i < count; i++ ) {
        pool = model->vertextras[ i ];
        offset += pool->position;
    }

    if ( pool->data_size - pool->position < length ) {
        pool = (prf_vertex_pool_t *)malloc( sizeof( prf_vertex_pool_t ) );
        assert( pool != NULL );
        pool->data = (uint8_t *)malloc( PRF_POOL_BLOCK_SIZE );
        assert( pool->data != NULL );
        pool->data_size = PRF_POOL_BLOCK_SIZE;
        pool->position = 0;
        model->vertextras = (struct prf_vertex_pool_s **)
          prf_array_append_ptr( model->vertextras, pool);
    }

    ptr8 = pool->data + pool->position;
    ptr16 = (uint16_t *) ptr8;
    pool->position += length;

    ptr16[0] = opcode;
    ptr16[1] = length;

    switch ( opcode ) {
    case 68: /* vertex_with_color */
        do {
            struct prf_vertex_with_color_data * data;
            data = (struct prf_vertex_with_color_data *) (ptr8 + 4);
            prf_dblwrite( data->x, vertex->x );
            prf_dblwrite( data->y, vertex->y );
            prf_dblwrite( data->z, vertex->z );
            data->color_name_index = vertex->color_name_index;
            data->flags = vertex->flags;
            data->packed_color = vertex->packed_color;
            data->color_index = vertex->color_index;
        } while ( FALSE );
        break;
    case 69: /* vertex_with_normal */
        do {
            struct prf_vertex_with_normal_data * data;
            data = (struct prf_vertex_with_normal_data *) (ptr8 + 4);
            prf_dblwrite( data->x, vertex->x );
            prf_dblwrite( data->y, vertex->y );
            prf_dblwrite( data->z, vertex->z );
            data->color_name_index = vertex->color_name_index;
            data->flags = vertex->flags;
            data->normal[0] = vertex->normal[0];
            data->normal[1] = vertex->normal[1];
            data->normal[2] = vertex->normal[2];
            data->packed_color = vertex->packed_color;
            data->color_index = vertex->color_index;
        } while ( FALSE );
        break;
    case 70: /* vertex_with_normal_and_texture */
        do {
            struct prf_vertex_with_normal_and_texture_data * data;
            data = (struct prf_vertex_with_normal_and_texture_data *) (ptr8+4);
            prf_dblwrite( data->x, vertex->x );
            prf_dblwrite( data->y, vertex->y );
            prf_dblwrite( data->z, vertex->z );
            data->color_name_index = vertex->color_name_index;
            data->flags = vertex->flags;
            data->normal[0] = vertex->normal[0];
            data->normal[1] = vertex->normal[1];
            data->normal[2] = vertex->normal[2];
            data->texture[0] = vertex->texture[0];
            data->texture[1] = vertex->texture[1];
            data->packed_color = vertex->packed_color;
            data->color_index = vertex->color_index;
        } while ( FALSE );
        break;
    case 71: /* vertex_with_texture */
        do {
            struct prf_vertex_with_texture_data * data;
            data = (struct prf_vertex_with_texture_data *) (ptr8 + 4);
            prf_dblwrite( data->x, vertex->x );
            prf_dblwrite( data->y, vertex->y );
            prf_dblwrite( data->z, vertex->z );
            data->color_name_index = vertex->color_name_index;
            data->flags = vertex->flags;
            data->texture[0] = vertex->texture[0];
            data->texture[1] = vertex->texture[1];
            data->packed_color = vertex->packed_color;
            data->color_index = vertex->color_index;
        } while ( FALSE );
        break;
    default:
        assert( 0 && "invalid opcode - how did this happen?" );
        break;
    }
    
    return offset;
}